

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

bool __thiscall dd::ProcessThreadImpl::Process(ProcessThreadImpl *this)

{
  value_type pQVar1;
  AutoLock AVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  rep rVar6;
  reference pMVar7;
  int64_t iVar8;
  rep time_now;
  const_reference pvVar9;
  reference ppQVar10;
  int64_t time_to_wait;
  QueuedTask *task;
  int64_t new_now;
  ModuleCallback *m;
  iterator __end2;
  iterator __begin2;
  ModuleList *__range2;
  AutoLock local_30;
  AutoLock l;
  int64_t next_checkpoint;
  int64_t now;
  ProcessThreadImpl *this_local;
  
  rVar6 = GetCurrentTick();
  l._lock = (Lock *)(rVar6 + 60000);
  AutoLock::AutoLock(&local_30,&this->_lock);
  if ((this->_stop & 1U) == 0) {
    __end2 = std::__cxx11::
             list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
             ::begin(&this->_modules);
    m = (ModuleCallback *)
        std::__cxx11::
        list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
        ::end(&this->_modules);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&m), bVar3) {
      pMVar7 = std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator*(&__end2);
      if (pMVar7->next_callback == 0) {
        iVar8 = GetNextCallbackTime(pMVar7->module,rVar6);
        pMVar7->next_callback = iVar8;
      }
      if ((pMVar7->next_callback <= rVar6) || (pMVar7->next_callback == -1)) {
        (*pMVar7->module->_vptr_Module[1])();
        time_now = GetCurrentTick();
        iVar8 = GetNextCallbackTime(pMVar7->module,time_now);
        pMVar7->next_callback = iVar8;
      }
      if (pMVar7->next_callback < (long)l._lock) {
        l._lock = (Lock *)pMVar7->next_callback;
      }
      std::_List_iterator<dd::ProcessThreadImpl::ModuleCallback>::operator++(&__end2);
    }
    while( true ) {
      bVar4 = std::
              priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
              ::empty(&this->_delayed_tasks);
      bVar3 = false;
      if (!bVar4) {
        pvVar9 = std::
                 priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
                 ::top(&this->_delayed_tasks);
        bVar3 = pvVar9->run_at_ms <= rVar6;
      }
      if (!bVar3) break;
      pvVar9 = std::
               priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
               ::top(&this->_delayed_tasks);
      std::queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>
      ::push(&this->_queue,&pvVar9->task);
      std::
      priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
      ::pop(&this->_delayed_tasks);
    }
    bVar3 = std::
            priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
            ::empty(&this->_delayed_tasks);
    if ((!bVar3) &&
       (pvVar9 = std::
                 priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
                 ::top(&this->_delayed_tasks), pvVar9->run_at_ms < (long)l._lock)) {
      pvVar9 = std::
               priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
               ::top(&this->_delayed_tasks);
      l._lock = (Lock *)pvVar9->run_at_ms;
    }
    while (bVar3 = std::
                   queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>
                   ::empty(&this->_queue), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppQVar10 = std::
                 queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>
                 ::front(&this->_queue);
      pQVar1 = *ppQVar10;
      std::queue<dd::QueuedTask_*,_std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>_>
      ::pop(&this->_queue);
      Lock::LockEnd(&this->_lock);
      uVar5 = (*pQVar1->_vptr_QueuedTask[2])();
      if (((uVar5 & 1) != 0) && (pQVar1 != (value_type)0x0)) {
        (*pQVar1->_vptr_QueuedTask[1])();
      }
      Lock::LockBegin(&this->_lock);
    }
    bVar3 = false;
  }
  else {
    this_local._7_1_ = 0;
    bVar3 = true;
  }
  AutoLock::~AutoLock(&local_30);
  AVar2 = l;
  if (!bVar3) {
    rVar6 = GetCurrentTick();
    if (0 < (long)AVar2._lock - rVar6) {
      Event::Wait(&this->_wake_up,(int)((long)AVar2._lock - rVar6));
    }
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ProcessThreadImpl::Process() {
		int64_t now = GetCurrentTick();
		int64_t next_checkpoint = now + (1000 * 60);

		{
			AutoLock l(_lock);
			if (_stop)
				return false;
			for (ModuleCallback& m : _modules) {
				if (m.next_callback == 0)
					m.next_callback = GetNextCallbackTime(m.module, now);
				if (m.next_callback <= now || m.next_callback == kCallProcessImmediately) {
					{
						m.module->Process();
					}
					int64_t new_now = GetCurrentTick();
					m.next_callback = GetNextCallbackTime(m.module, new_now);
				}

				if (m.next_callback < next_checkpoint)
					next_checkpoint = m.next_callback;
			}

			while (!_delayed_tasks.empty() && _delayed_tasks.top().run_at_ms <= now) {
				_queue.push(_delayed_tasks.top().task);
				_delayed_tasks.pop();
			}

			if (!_delayed_tasks.empty())
			{
				if (_delayed_tasks.top().run_at_ms < next_checkpoint)
					next_checkpoint = _delayed_tasks.top().run_at_ms;
			}

			while (!_queue.empty()) {
				QueuedTask* task = _queue.front();
				_queue.pop();
				_lock.LockEnd();
				if (task->Run())
					delete task;
				_lock.LockBegin();
			}
		}
		
		int64_t time_to_wait = next_checkpoint - GetCurrentTick();
		if (time_to_wait > 0)
			_wake_up.Wait(static_cast<int>(time_to_wait));
		return true;
	}